

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.cpp
# Opt level: O3

void __thiscall gdsSTR::reset(gdsSTR *this)

{
  pointer pgVar1;
  pointer pgVar2;
  pointer pgVar3;
  pointer pgVar4;
  pointer pgVar5;
  pointer pgVar6;
  pointer pgVar7;
  pointer pgVar8;
  pointer pgVar9;
  pointer pgVar10;
  pointer pgVar11;
  pointer pgVar12;
  pointer pgVar13;
  pointer pgVar14;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  pointer this_03;
  pointer this_04;
  pointer this_05;
  pointer this_06;
  string name;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  this->heirarchical_level = 0;
  this->bounding_box[0] = 0;
  this->bounding_box[1] = 0;
  pgVar1 = (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar2 = (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_00 = pgVar1;
  if (pgVar2 != pgVar1) {
    do {
      gdsBOUNDARY::~gdsBOUNDARY(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pgVar2);
    (this->BOUNDARY).super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar1;
  }
  pgVar3 = (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar4 = (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = pgVar3;
  if (pgVar4 != pgVar3) {
    do {
      gdsPATH::~gdsPATH(this_01);
      this_01 = this_01 + 1;
    } while (this_01 != pgVar4);
    (this->PATH).super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar3;
  }
  pgVar5 = (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar6 = (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_02 = pgVar5;
  if (pgVar6 != pgVar5) {
    do {
      gdsSREF::~gdsSREF(this_02);
      this_02 = this_02 + 1;
    } while (this_02 != pgVar6);
    (this->SREF).super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar5;
  }
  pgVar7 = (this->AREF).super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar8 = (this->AREF).super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_03 = pgVar7;
  if (pgVar8 != pgVar7) {
    do {
      gdsAREF::~gdsAREF(this_03);
      this_03 = this_03 + 1;
    } while (this_03 != pgVar8);
    (this->AREF).super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar7;
  }
  pgVar9 = (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
           super__Vector_impl_data._M_start;
  pgVar10 = (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_04 = pgVar9;
  if (pgVar10 != pgVar9) {
    do {
      gdsTEXT::~gdsTEXT(this_04);
      this_04 = this_04 + 1;
    } while (this_04 != pgVar10);
    (this->TEXT).super__Vector_base<gdsTEXT,_std::allocator<gdsTEXT>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar9;
  }
  pgVar11 = (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
            super__Vector_impl_data._M_start;
  pgVar12 = (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_05 = pgVar11;
  if (pgVar12 != pgVar11) {
    do {
      gdsNODE::~gdsNODE(this_05);
      this_05 = this_05 + 1;
    } while (this_05 != pgVar12);
    (this->NODE).super__Vector_base<gdsNODE,_std::allocator<gdsNODE>_>._M_impl.
    super__Vector_impl_data._M_finish = pgVar11;
  }
  pgVar13 = (this->BOX).super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
            super__Vector_impl_data._M_start;
  pgVar14 = (this->BOX).super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_06 = pgVar13;
  if (pgVar14 != pgVar13) {
    do {
      gdsBOX::~gdsBOX(this_06);
      this_06 = this_06 + 1;
    } while (this_06 != pgVar14);
    (this->BOX).super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl.super__Vector_impl_data.
    _M_finish = pgVar13;
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void gdsSTR::reset()
{
  string name = "\0";
  heirarchical_level = 0;
  bounding_box[0] = {0};
  bounding_box[1] = {0};
  BOUNDARY.clear();
  PATH.clear();
  SREF.clear();
  AREF.clear();
  TEXT.clear();
  NODE.clear();
  BOX.clear();
}